

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::setHighsOptionValue(Highs *this,string *option,double value)

{
  HighsStatus HVar1;
  allocator local_5a;
  allocator local_59;
  double local_58;
  string local_50;
  string local_30;
  
  local_58 = value;
  std::__cxx11::string::string((string *)&local_30,"setHighsOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_50,"setOptionValue",&local_5a);
  deprecationMessage(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  HVar1 = setOptionValue(this,option,local_58);
  return HVar1;
}

Assistant:

HighsStatus Highs::setHighsOptionValue(const std::string& option,
                                       const double value) {
  deprecationMessage("setHighsOptionValue", "setOptionValue");
  return setOptionValue(option, value);
}